

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O1

ns_connection * ns_add_sock(ns_mgr *s,sock_t sock,ns_callback_t callback,void *user_data)

{
  ns_connection *pnVar1;
  uint uVar2;
  ns_connection *__s;
  time_t tVar3;
  
  __s = (ns_connection *)malloc(0xa0);
  if (__s != (ns_connection *)0x0) {
    memset(__s,0,0xa0);
    uVar2 = fcntl64(sock,3,0);
    fcntl64(sock,4,uVar2 | 0x800);
    fcntl64(sock,2,1);
    __s->sock = sock;
    __s->user_data = user_data;
    __s->callback = callback;
    __s->mgr = s;
    tVar3 = time((time_t *)0x0);
    __s->last_io_time = tVar3;
    pnVar1 = s->active_connections;
    __s->next = pnVar1;
    s->active_connections = __s;
    __s->prev = (ns_connection *)0x0;
    if (pnVar1 != (ns_connection *)0x0) {
      pnVar1->prev = __s;
    }
  }
  return __s;
}

Assistant:

struct ns_connection *ns_add_sock(struct ns_mgr *s, sock_t sock,
                                  ns_callback_t callback, void *user_data) {
  struct ns_connection *conn;
  if ((conn = (struct ns_connection *) NS_MALLOC(sizeof(*conn))) != NULL) {
    memset(conn, 0, sizeof(*conn));
    ns_set_non_blocking_mode(sock);
    ns_set_close_on_exec(sock);
    conn->sock = sock;
    conn->user_data = user_data;
    conn->callback = callback;
    conn->mgr = s;
    conn->last_io_time = time(NULL);
    ns_add_conn(s, conn);
    DBG(("%p %d", conn, sock));
  }
  return conn;
}